

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O2

void trico_decompress(uint32_t *number_of_floats,float **out,uint8_t *compressed)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  void *__ptr;
  void *__ptr_00;
  float *pfVar7;
  sbyte sVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int j_1;
  uint uVar16;
  ulong uVar17;
  int j;
  uint32_t uVar18;
  ulong uVar19;
  uint uVar20;
  float fVar21;
  uint uVar22;
  float fVar23;
  byte *pbVar25;
  long lVar26;
  ulong uVar27;
  size_t __nmemb;
  uint32_t xor [8];
  uint32_t bcode [8];
  uint uVar24;
  
  bVar9 = *compressed;
  bVar6 = bVar9 >> 3 & 0xfe;
  uVar16 = (uint)bVar9 + (uint)bVar9 & 0x1e;
  sVar8 = (sbyte)uVar16;
  __nmemb = 1L << sVar8;
  uVar11 = (int)(1L << bVar6) - 1;
  uVar12 = (int)__nmemb - 1;
  __ptr = calloc(1L << bVar6,4);
  __ptr_00 = calloc(__nmemb,4);
  bVar9 = compressed[1];
  *number_of_floats = (uint)bVar9 << 0x18;
  uVar13 = (uint)compressed[2] << 0x10 | (uint)bVar9 << 0x18;
  *number_of_floats = uVar13;
  uVar13 = (uint)compressed[3] << 8 | uVar13;
  *number_of_floats = uVar13;
  pbVar25 = compressed + 5;
  uVar13 = compressed[4] | uVar13;
  *number_of_floats = uVar13;
  pfVar7 = (float *)malloc((ulong)uVar13 * 4);
  *out = pfVar7;
  bVar9 = 0x20 - sVar8;
  uVar15 = 0;
  uVar24 = 0;
  uVar19 = 0;
  uVar22 = 0;
  fVar21 = 0.0;
  for (uVar14 = 0; sVar8 = (sbyte)(uVar16 >> 1), uVar14 != uVar13 >> 3; uVar14 = uVar14 + 1) {
    bVar2 = *pbVar25;
    bVar3 = pbVar25[1];
    bVar4 = pbVar25[2];
    pbVar25 = pbVar25 + 3;
    bVar10 = 0;
    for (lVar26 = 0; lVar26 != 8; lVar26 = lVar26 + 1) {
      uVar20 = ((uint)bVar4 | (uint)bVar3 << 8 | (uint)bVar2 << 0x10) >> (bVar10 & 0x1f) & 7;
      bcode[lVar26] = uVar20;
      switch(uVar20) {
      case 0:
        xor[lVar26] = 0;
        goto LAB_00106917;
      case 1:
        uVar18 = (uint32_t)*pbVar25;
        pbVar25 = pbVar25 + 1;
        goto LAB_00106913;
      case 2:
        uVar20 = (uint)*pbVar25 << 8;
        xor[lVar26] = uVar20;
        bVar5 = pbVar25[1];
        pbVar25 = pbVar25 + 2;
        break;
      default:
        bVar5 = *pbVar25;
        xor[lVar26] = (uint)bVar5 << 0x10;
        uVar20 = (uint)pbVar25[1] << 8 | (uint)bVar5 << 0x10;
        xor[lVar26] = uVar20;
        bVar5 = pbVar25[2];
        pbVar25 = pbVar25 + 3;
        break;
      case 4:
        bVar5 = *pbVar25;
        xor[lVar26] = (uint)bVar5 << 0x18;
        uVar20 = (uint)pbVar25[1] << 0x10 | (uint)bVar5 << 0x18;
        xor[lVar26] = uVar20;
        uVar20 = (uint)pbVar25[2] << 8 | uVar20;
        xor[lVar26] = uVar20;
        bVar5 = pbVar25[3];
        pbVar25 = pbVar25 + 4;
        goto LAB_00106910;
      case 5:
        uVar18 = (uint32_t)*pbVar25;
        pbVar25 = pbVar25 + 1;
        goto LAB_001068af;
      case 6:
        uVar20 = (uint)*pbVar25 << 8;
        xor[lVar26] = uVar20;
        bVar5 = pbVar25[1];
        pbVar25 = pbVar25 + 2;
LAB_00106910:
        uVar18 = bVar5 | uVar20;
LAB_00106913:
        xor[lVar26] = uVar18;
        goto LAB_00106917;
      }
      uVar18 = bVar5 | uVar20;
LAB_001068af:
      xor[lVar26] = uVar18;
LAB_00106917:
      bVar10 = bVar10 + 3;
    }
    for (lVar26 = 0; lVar26 != 0x20; lVar26 = lVar26 + 4) {
      if (4 < *(uint *)((long)bcode + lVar26)) {
        uVar24 = uVar22;
      }
      fVar23 = (float)(uVar24 ^ *(uint *)((long)xor + lVar26));
      *(float *)((long)__ptr + (ulong)uVar15 * 4) = fVar23;
      *(int *)((long)__ptr_00 + uVar19 * 4) = (int)fVar23 - (int)fVar21;
      uVar15 = ((uint)fVar23 >> (0x20 - bVar6 & 0x1f) ^ uVar15 << bVar6) & uVar11;
      uVar20 = ((uint)((int)fVar23 - (int)fVar21) >> (bVar9 & 0x1f) ^ (int)uVar19 << sVar8) & uVar12
      ;
      uVar22 = *(int *)((long)__ptr_00 + (ulong)uVar20 * 4) + (int)fVar23;
      *(float *)((long)pfVar7 + lVar26) = fVar23;
      uVar24 = *(uint *)((long)__ptr + (ulong)uVar15 * 4);
      uVar19 = (ulong)uVar20;
      fVar21 = fVar23;
    }
    pfVar7 = pfVar7 + 8;
  }
  if ((*number_of_floats & 7) != 0) {
    bVar2 = *pbVar25;
    bVar3 = pbVar25[1];
    bVar4 = pbVar25[2];
    pbVar25 = pbVar25 + 3;
    uVar27 = 8;
    bVar10 = 0;
    for (uVar17 = 0; (long)uVar17 < (long)(int)uVar27; uVar17 = uVar17 + 1) {
      uVar13 = ((uint)bVar4 | (uint)bVar3 << 8 | (uint)bVar2 << 0x10) >> (bVar10 & 0x1f) & 7;
      bcode[uVar17] = uVar13;
      switch(uVar13) {
      case 0:
        xor[uVar17] = 0;
        break;
      case 1:
        bVar5 = *pbVar25;
        pbVar25 = pbVar25 + 1;
        xor[uVar17] = (uint)bVar5;
        if (bVar5 == 0) {
          uVar27 = uVar17;
        }
        uVar27 = uVar27 & 0xffffffff;
        break;
      default:
        uVar13 = (uint)*pbVar25 << 8;
        xor[uVar17] = uVar13;
        bVar5 = pbVar25[1];
        pbVar25 = pbVar25 + 2;
        goto LAB_00106a73;
      case 3:
      case 7:
        bVar5 = *pbVar25;
        xor[uVar17] = (uint)bVar5 << 0x10;
        uVar13 = (uint)pbVar25[1] << 8 | (uint)bVar5 << 0x10;
        xor[uVar17] = uVar13;
        pbVar1 = pbVar25 + 2;
        pbVar25 = pbVar25 + 3;
        uVar18 = *pbVar1 | uVar13;
        goto LAB_00106a9d;
      case 4:
        bVar5 = *pbVar25;
        xor[uVar17] = (uint)bVar5 << 0x18;
        uVar13 = (uint)pbVar25[1] << 0x10 | (uint)bVar5 << 0x18;
        xor[uVar17] = uVar13;
        uVar13 = (uint)pbVar25[2] << 8 | uVar13;
        xor[uVar17] = uVar13;
        bVar5 = pbVar25[3];
        pbVar25 = pbVar25 + 4;
LAB_00106a73:
        xor[uVar17] = bVar5 | uVar13;
        break;
      case 5:
        uVar18 = (uint32_t)*pbVar25;
        pbVar25 = pbVar25 + 1;
LAB_00106a9d:
        xor[uVar17] = uVar18;
      }
      bVar10 = bVar10 + 3;
    }
    uVar17 = 0;
    if ((int)uVar27 < 1) {
      uVar27 = uVar17;
    }
    for (; uVar27 != uVar17; uVar17 = uVar17 + 1) {
      if (4 < bcode[uVar17]) {
        uVar24 = uVar22;
      }
      fVar23 = (float)(uVar24 ^ xor[uVar17]);
      *(float *)((long)__ptr + (ulong)uVar15 * 4) = fVar23;
      *(int *)((long)__ptr_00 + uVar19 * 4) = (int)fVar23 - (int)fVar21;
      uVar15 = ((uint)fVar23 >> (0x20 - bVar6 & 0x1f) ^ uVar15 << bVar6) & uVar11;
      uVar19 = (ulong)(((uint)((int)fVar23 - (int)fVar21) >> (bVar9 & 0x1f) ^ (int)uVar19 << sVar8)
                      & uVar12);
      uVar22 = *(int *)((long)__ptr_00 + uVar19 * 4) + (int)fVar23;
      pfVar7[uVar17] = fVar23;
      uVar24 = *(uint *)((long)__ptr + (ulong)uVar15 * 4);
      fVar21 = fVar23;
    }
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void trico_decompress(uint32_t* number_of_floats, float** out, const uint8_t* compressed)
  {
  uint8_t hash_info = *compressed++;

  uint32_t hash1_size_exponent = (hash_info >> 4) << 1;
  uint32_t hash2_size_exponent = (hash_info & 15) << 1;

  const uint32_t hash1_size = 1 << hash1_size_exponent;
  const uint32_t hash2_size = 1 << hash2_size_exponent;
  const uint32_t hash1_mask = hash1_size - 1;
  const uint32_t hash2_mask = hash2_size - 1;

  uint32_t* hash_table_1 = (uint32_t*)trico_calloc(hash1_size, 4);
  uint32_t* hash_table_2 = (uint32_t*)trico_calloc(hash2_size, 4);

  *number_of_floats = ((uint32_t)(*compressed++)) << 24;
  *number_of_floats |= ((uint32_t)(*compressed++)) << 16;
  *number_of_floats |= ((uint32_t)(*compressed++)) << 8;
  *number_of_floats |= ((uint32_t)(*compressed++));
  *out = (float*)trico_malloc(*number_of_floats * sizeof(float));

  uint32_t bc;
  uint32_t bcode[8];
  uint32_t xor[8];
  uint32_t value;
  uint32_t hash1 = 0;
  uint32_t prediction1 = 0;
  uint32_t hash2 = 0;
  uint32_t prediction2 = 0;
  uint32_t stride;
  uint32_t last_value = 0;
  uint32_t* p_out = (uint32_t*)(*out);

  const uint32_t cnt = *number_of_floats / 8;
  for (uint32_t q = 0; q < cnt; ++q)
    {
    bc = ((uint32_t)(*compressed++)) << 16;
    bc |= ((uint32_t)(*compressed++)) << 8;
    bc |= (*compressed++);
    for (int j = 0; j < 8; ++j)
      {
      uint8_t b = (bc >> (j * 3)) & 7;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint32_t)(*compressed++));
        break;
        }
        case 2:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 24;
        xor[j] |= ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint32_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < 8; ++j)
      {
      if (bcode[j] > 4)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_32(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_32(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  if (*number_of_floats & 7)
    {
    bc = ((uint32_t)(*compressed++)) << 16;
    bc |= ((uint32_t)(*compressed++)) << 8;
    bc |= (*compressed++);
    int max_j = 8;
    for (int j = 0; j < max_j; ++j)
      {
      uint8_t b = (bc >> (j * 3)) & 7;
      bcode[j] = b;
      switch (b)
        {
        case 0:
        {
        xor[j] = 0;
        break;
        }
        case 1:
        {
        xor[j] = ((uint32_t)(*compressed++));
        if (xor[j] == 0)
          max_j = j;
        break;
        }
        case 2:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 3:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 4:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 24;
        xor[j] |= ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 5:
        {
        xor[j] = ((uint32_t)(*compressed++));
        break;
        }
        case 6:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        case 7:
        {
        xor[j] = ((uint32_t)(*compressed++)) << 16;
        xor[j] |= ((uint32_t)(*compressed++)) << 8;
        xor[j] |= ((uint32_t)(*compressed++));
        break;
        }
        }
      }
    for (int j = 0; j < max_j; ++j)
      {
      if (bcode[j] > 4)
        prediction1 = prediction2;

      value = xor[j] ^ prediction1;

      hash_table_1[hash1] = value;
      hash1 = trico_compute_hash1_32(hash1, value, hash1_size_exponent, hash1_mask);
      prediction1 = hash_table_1[hash1];

      stride = value - last_value;
      hash_table_2[hash2] = stride;
      hash2 = trico_compute_hash2_32(hash2, stride, hash2_size_exponent, hash2_mask);
      prediction2 = value + hash_table_2[hash2];
      last_value = value;

      *p_out++ = value;
      }
    }

  trico_free(hash_table_1);
  trico_free(hash_table_2);
  }